

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

ScriptPtr * __thiscall FBehavior::FindScript(FBehavior *this,int script)

{
  ScriptPtr *local_20;
  ScriptPtr *ptr;
  int script_local;
  FBehavior *this_local;
  
  local_20 = BinarySearch<ScriptPtr,int>(this->Scripts,this->NumScripts,0,script);
  if ((this->Scripts < local_20) && (local_20[-1].Number == script)) {
    local_20 = local_20 + -1;
  }
  return local_20;
}

Assistant:

const ScriptPtr *FBehavior::FindScript (int script) const
{
	const ScriptPtr *ptr = BinarySearch<ScriptPtr, int>
		((ScriptPtr *)Scripts, NumScripts, &ScriptPtr::Number, script);

	// If the preceding script has the same number, return it instead.
	// See the note by the script sorting above for why.
	if (ptr > Scripts)
	{
		if (ptr[-1].Number == script)
		{
			ptr--;
		}
	}
	return ptr;
}